

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O0

void __thiscall ClassBundle::updateFieldType(ClassBundle *this,FieldType *type)

{
  bool bVar1;
  __type _Var2;
  reference pbVar3;
  reference pCVar4;
  ulong uVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [8];
  string classType;
  Class *targetClass;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Class,_std::allocator<Class>_> *__range1_2;
  string local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> builtinClass;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string remainingType;
  undefined1 local_a8 [8];
  string cleanType;
  undefined1 local_78 [8];
  Field onlyBaseType;
  FieldType *itr;
  iterator __end1;
  iterator __begin1;
  vector<FieldType,_std::allocator<FieldType>_> *__range1;
  FieldType *type_local;
  ClassBundle *this_local;
  
  __end1 = std::vector<FieldType,_std::allocator<FieldType>_>::begin(&type->templateTypes);
  itr = (FieldType *)std::vector<FieldType,_std::allocator<FieldType>_>::end(&type->templateTypes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<FieldType_*,_std::vector<FieldType,_std::allocator<FieldType>_>_>
                                     *)&itr), bVar1) {
    onlyBaseType._56_8_ =
         __gnu_cxx::
         __normal_iterator<FieldType_*,_std::vector<FieldType,_std::allocator<FieldType>_>_>::
         operator*(&__end1);
    updateFieldType(this,(FieldType *)onlyBaseType._56_8_);
    __gnu_cxx::__normal_iterator<FieldType_*,_std::vector<FieldType,_std::allocator<FieldType>_>_>::
    operator++(&__end1);
  }
  Field::Field((Field *)local_78);
  std::__cxx11::string::operator=((string *)local_78,(string *)type);
  Field::onlyType_abi_cxx11_((Field *)local_a8);
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&__range1_1,(ulong)local_78);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&builtinClasses_abi_cxx11_);
  local_e0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&builtinClasses_abi_cxx11_);
  while (bVar1 = __gnu_cxx::operator!=(&__end1_1,&local_e0), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    std::__cxx11::string::string(local_100,(string *)pbVar3);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_100);
    std::__cxx11::string::~string(local_100);
    if (_Var2) goto LAB_0011a1d7;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<Class,_std::allocator<Class>_>::begin(&this->allClasses);
  targetClass = (Class *)std::vector<Class,_std::allocator<Class>_>::end(&this->allClasses);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>
                             *)&targetClass), bVar1) {
    pCVar4 = __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::
             operator*(&__end1_2);
    std::operator+(local_148,&pCVar4->scope);
    uVar5 = std::__cxx11::string::size();
    uVar6 = std::__cxx11::string::size();
    if (uVar5 < uVar6) {
      __range1_2._4_4_ = 7;
    }
    else {
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_168,(ulong)local_148);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,local_168);
      std::__cxx11::string::~string((string *)local_168);
      if (_Var2) {
        std::operator+(local_188,local_148);
        std::__cxx11::string::operator=((string *)type,(string *)local_188);
        std::__cxx11::string::~string((string *)local_188);
        __range1_2._4_4_ = 1;
      }
      else {
        __range1_2._4_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_148);
    if ((__range1_2._4_4_ != 0) && (__range1_2._4_4_ != 7)) goto LAB_0011a1d7;
    __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::operator++
              (&__end1_2);
  }
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->unknownClasses,(key_type *)local_a8);
  if (*pmVar7 != 1) {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->unknownClasses,(key_type *)local_a8);
    *pmVar7 = 1;
    poVar8 = std::operator<<((ostream *)&std::cerr,"[Warning]\t");
    poVar8 = std::operator<<(poVar8,"Cannot determine full scope for class \"");
    poVar8 = std::operator<<(poVar8,(string *)local_a8);
    std::operator<<(poVar8,"\"\n");
  }
LAB_0011a1d7:
  std::__cxx11::string::~string((string *)&__range1_1);
  std::__cxx11::string::~string((string *)local_a8);
  Field::~Field((Field *)local_78);
  return;
}

Assistant:

void updateFieldType(FieldType &type) {
        // solve childrens
        for (auto& itr : type.templateTypes) {
            updateFieldType(itr);
        }

        Field onlyBaseType;
        onlyBaseType.type = type.name;

        std::string cleanType = onlyBaseType.onlyType();
        std::string remainingType = onlyBaseType.type.substr(cleanType.size(), onlyBaseType.type.size());

        for (auto builtinClass : this->builtinClasses) {
            if (cleanType == builtinClass) {
                return;
            }
        }

        for (auto& targetClass : this->allClasses) {
            // check if classType ends with my type
            std::string classType = targetClass.scope + targetClass.name;

            if (classType.size() < cleanType.size()) {
                continue;
            }

            if (cleanType == classType.substr(classType.size() - cleanType.size(), cleanType.size())) {
                type.name = classType + remainingType;
                return;
            }
        }

        if (unknownClasses[cleanType] == 1) {
            return;
        }

        unknownClasses[cleanType] = 1;
        std::cerr << "[Warning]\t" << "Cannot determine full scope for class \"" << cleanType << "\"\n";

    }